

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O0

SUNErrCode
SUNAdaptController_EstimateStep_ImExGus
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  int iVar1;
  double *in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double in_XMM1_Qa;
  sunrealtype hrat;
  sunrealtype e2;
  sunrealtype e1;
  sunrealtype k2i;
  sunrealtype k1i;
  sunrealtype k2e;
  sunrealtype k1e;
  sunrealtype e;
  sunrealtype k;
  int ord;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_d8;
  undefined8 local_a0;
  undefined8 local_90;
  undefined8 local_88;
  
  iVar1 = in_ESI + 1;
  if (*(double *)(*in_RDI + 0x20) * in_XMM1_Qa <= 1e-10) {
    local_88 = 1e-10;
  }
  else {
    local_88 = *(double *)(*in_RDI + 0x20) * in_XMM1_Qa;
  }
  dVar2 = -*(double *)(*in_RDI + 0x10) / (double)iVar1;
  dVar3 = -*(double *)(*in_RDI + 0x18) / (double)iVar1;
  dVar6 = *(double *)*in_RDI;
  dVar4 = -*(double *)(*in_RDI + 8) / (double)iVar1;
  if (*(double *)(*in_RDI + 0x20) * in_XMM1_Qa <= 1e-10) {
    local_90 = 1e-10;
  }
  else {
    local_90 = *(double *)(*in_RDI + 0x20) * in_XMM1_Qa;
  }
  if (*(double *)(*in_RDI + 0x28) <= 1e-10) {
    local_a0 = 1e-10;
  }
  else {
    local_a0 = *(double *)(*in_RDI + 0x28);
  }
  local_a0 = local_90 / local_a0;
  dVar5 = in_XMM0_Qa / *(double *)(*in_RDI + 0x30);
  if (*(int *)(*in_RDI + 0x38) == 0) {
    dVar7 = (double)SUNRpowerR(local_90,-dVar6 / (double)iVar1);
    dVar8 = (double)SUNRpowerR(local_a0,dVar4);
    dVar9 = (double)SUNRpowerR(local_90,dVar2);
    dVar10 = (double)SUNRpowerR(local_a0,dVar3);
    if (dVar9 * dVar10 <= dVar5 * dVar7 * dVar8) {
      local_d8 = (double)SUNRpowerR(local_90,dVar2);
      dVar6 = (double)SUNRpowerR(local_a0,dVar3);
      local_d8 = local_d8 * dVar6;
    }
    else {
      dVar6 = (double)SUNRpowerR(local_90,-dVar6 / (double)iVar1);
      local_d8 = (double)SUNRpowerR(local_a0,dVar4);
      local_d8 = dVar5 * dVar6 * local_d8;
    }
    *in_RDX = in_XMM0_Qa * local_d8;
  }
  else {
    dVar6 = (double)SUNRpowerR(local_88,-1.0 / (double)iVar1);
    *in_RDX = in_XMM0_Qa * dVar6;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_ImExGus(SUNAdaptController C,
                                                   sunrealtype h, int p,
                                                   sunrealtype dsm,
                                                   sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  SUNAssert(hnew, SUN_ERR_ARG_CORRUPT);

  /* order parameter to use */
  const int ord = p + 1;

  /* set usable time-step adaptivity parameters -- first step */
  const sunrealtype k = -SUN_RCONST(1.0) / ord;
  const sunrealtype e = SUNMAX(SACIMEXGUS_BIAS(C) * dsm, TINY);

  /* set usable time-step adaptivity parameters -- subsequent steps */
  const sunrealtype k1e  = -SACIMEXGUS_K1E(C) / ord;
  const sunrealtype k2e  = -SACIMEXGUS_K2E(C) / ord;
  const sunrealtype k1i  = -SACIMEXGUS_K1I(C) / ord;
  const sunrealtype k2i  = -SACIMEXGUS_K2I(C) / ord;
  const sunrealtype e1   = SUNMAX(SACIMEXGUS_BIAS(C) * dsm, TINY);
  const sunrealtype e2   = e1 / SUNMAX(SACIMEXGUS_EP(C), TINY);
  const sunrealtype hrat = h / SACIMEXGUS_HP(C);

  /* compute estimated time step size, modifying the first step formula */
  if (SACIMEXGUS_FIRSTSTEP(C)) { *hnew = h * SUNRpowerR(e, k); }
  else
  {
    *hnew = h * SUNMIN(hrat * SUNRpowerR(e1, k1i) * SUNRpowerR(e2, k2i),
                       SUNRpowerR(e1, k1e) * SUNRpowerR(e2, k2e));
  }

  /* return with success */
  return SUN_SUCCESS;
}